

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string_t * __thiscall
el::base::DefaultLogBuilder::build_abi_cxx11_
          (string_t *__return_storage_ptr__,DefaultLogBuilder *this,LogMessage *logMessage,
          bool appendNewLine)

{
  TypedConfigurations *this_00;
  DateTime *this_01;
  LogMessage *pLVar1;
  uint uVar2;
  LogFormat *pLVar3;
  SubsecondPrecision *format;
  char *pcVar4;
  undefined7 in_register_00000009;
  SubsecondPrecision *ssPrec;
  pointer pCVar5;
  allocator local_121;
  string_t *local_120;
  LogMessage *local_118;
  string fs;
  string_t wcsFormatSpecifier;
  string local_c8;
  char buff [110];
  char local_3a [10];
  
  ssPrec = (SubsecondPrecision *)CONCAT71(in_register_00000009,appendNewLine);
  this_00 = logMessage->m_logger->m_typedConfigurations;
  local_118 = logMessage;
  pLVar3 = TypedConfigurations::logFormat(this_00,logMessage->m_level);
  local_120 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pLVar3->m_format);
  buff[0x60] = '\0';
  buff[0x61] = '\0';
  buff[0x62] = '\0';
  buff[99] = '\0';
  buff[100] = '\0';
  buff[0x65] = '\0';
  buff[0x66] = '\0';
  buff[0x67] = '\0';
  buff[0x68] = '\0';
  buff[0x69] = '\0';
  buff[0x6a] = '\0';
  buff[0x6b] = '\0';
  buff[0x6c] = '\0';
  buff[0x6d] = '\0';
  buff[0x50] = '\0';
  buff[0x51] = '\0';
  buff[0x52] = '\0';
  buff[0x53] = '\0';
  buff[0x54] = '\0';
  buff[0x55] = '\0';
  buff[0x56] = '\0';
  buff[0x57] = '\0';
  buff[0x58] = '\0';
  buff[0x59] = '\0';
  buff[0x5a] = '\0';
  buff[0x5b] = '\0';
  buff[0x5c] = '\0';
  buff[0x5d] = '\0';
  buff[0x5e] = '\0';
  buff[0x5f] = '\0';
  buff[0x40] = '\0';
  buff[0x41] = '\0';
  buff[0x42] = '\0';
  buff[0x43] = '\0';
  buff[0x44] = '\0';
  buff[0x45] = '\0';
  buff[0x46] = '\0';
  buff[0x47] = '\0';
  buff[0x48] = '\0';
  buff[0x49] = '\0';
  buff[0x4a] = '\0';
  buff[0x4b] = '\0';
  buff[0x4c] = '\0';
  buff[0x4d] = '\0';
  buff[0x4e] = '\0';
  buff[0x4f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  uVar2 = pLVar3->m_flags;
  if ((uVar2 >> 0xb & 1) != 0) {
    std::__cxx11::string::string((string *)&fs,"%app",(allocator *)&wcsFormatSpecifier);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&local_118->m_logger->m_parentApplicationName);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    std::__cxx11::string::string((string *)&fs,"%thread",&local_121);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    Storage::getThreadName(&wcsFormatSpecifier,elStorage,&local_c8);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 & 2) != 0) {
    std::__cxx11::string::string((string *)&fs,"%datetime",(allocator *)&local_c8);
    this_01 = (DateTime *)(pLVar3->m_dateTimeFormat)._M_dataplus._M_p;
    format = TypedConfigurations::subsecondPrecision(this_00,local_118->m_level);
    utils::DateTime::getDateTime_abi_cxx11_(&wcsFormatSpecifier,this_01,(char *)format,ssPrec);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 & 0x40) != 0) {
    std::__cxx11::string::string((string *)&fs,"%func",(allocator *)&wcsFormatSpecifier);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&local_118->m_func);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 & 8) != 0) {
    buff._0_8_ = buff._0_8_ & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_118->m_file)._M_dataplus._M_p,buff,100);
    std::__cxx11::string::string((string *)&fs,"%file",(allocator *)&local_c8);
    std::__cxx11::string::string((string *)&wcsFormatSpecifier,buff,&local_121);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    buff._0_8_ = buff._0_8_ & 0xffffffffffffff00;
    utils::File::buildBaseFilename(&local_118->m_file,buff,100,"/");
    std::__cxx11::string::string((string *)&fs,"%fbase",(allocator *)&local_c8);
    std::__cxx11::string::string((string *)&wcsFormatSpecifier,buff,&local_121);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 & 0x10) != 0) {
    buff._0_8_ = buff._0_8_ & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff(local_118->m_line,10,buff,local_3a,false);
    std::__cxx11::string::string((string *)&fs,"%line",(allocator *)&local_c8);
    std::__cxx11::string::string((string *)&wcsFormatSpecifier,buff,&local_121);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  pLVar1 = local_118;
  if ((uVar2 & 0x20) != 0) {
    buff._0_8_ = buff._0_8_ & 0xffffffffffffff00;
    utils::File::buildStrippedFilename((local_118->m_file)._M_dataplus._M_p,buff,100);
    pcVar4 = utils::Str::addToBuff(buff,buff,local_3a);
    pcVar4 = utils::Str::addToBuff(":",pcVar4,local_3a);
    utils::Str::convertAndAddToBuff(pLVar1->m_line,10,pcVar4,local_3a,false);
    std::__cxx11::string::string((string *)&fs,"%loc",(allocator *)&local_c8);
    std::__cxx11::string::string((string *)&wcsFormatSpecifier,buff,&local_121);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((local_118->m_level == Verbose) && ((uVar2 & 0x400) != 0)) {
    buff._0_8_ = buff._0_8_ & 0xffffffffffffff00;
    utils::Str::convertAndAddToBuff((ulong)local_118->m_verboseLevel,1,buff,local_3a,false);
    std::__cxx11::string::string((string *)&fs,"%vlevel",(allocator *)&local_c8);
    std::__cxx11::string::string((string *)&wcsFormatSpecifier,buff,&local_121);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
    uVar2 = pLVar3->m_flags;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    std::__cxx11::string::string((string *)&fs,"%msg",(allocator *)&wcsFormatSpecifier);
    utils::Str::replaceFirstWithEscape(local_120,&fs,&local_118->m_message);
    std::__cxx11::string::~string((string *)&fs);
  }
  for (pCVar5 = (elStorage->m_customFormatSpecifiers).
                super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar5 != (elStorage->m_customFormatSpecifiers).
                super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
    std::__cxx11::string::string
              ((string *)&fs,pCVar5->m_formatSpecifier,(allocator *)&wcsFormatSpecifier);
    wcsFormatSpecifier._M_dataplus._M_p = (pointer)&wcsFormatSpecifier.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&wcsFormatSpecifier,fs._M_dataplus._M_p,
               fs._M_dataplus._M_p + fs._M_string_length);
    utils::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_el::LogMessage_*)>
    ::operator()(&local_c8,&pCVar5->m_resolver,local_118);
    utils::Str::replaceFirstWithEscape(local_120,&wcsFormatSpecifier,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&wcsFormatSpecifier);
    std::__cxx11::string::~string((string *)&fs);
  }
  if (appendNewLine) {
    std::__cxx11::string::append((char *)local_120);
  }
  return local_120;
}

Assistant:

base::type::string_t DefaultLogBuilder::build(const LogMessage* logMessage, bool appendNewLine) const {
  base::TypedConfigurations* tc = logMessage->logger()->typedConfigurations();
  const base::LogFormat* logFormat = &tc->logFormat(logMessage->level());
  base::type::string_t logLine = logFormat->format();
  char buff[base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength] = "";
  const char* bufLim = buff + sizeof(buff);
  if (logFormat->hasFlag(base::FormatFlags::AppName)) {
    // App name
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kAppNameFormatSpecifier,
        logMessage->logger()->parentApplicationName());
  }
  if (logFormat->hasFlag(base::FormatFlags::ThreadId)) {
    // Thread ID
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kThreadIdFormatSpecifier,
        ELPP->getThreadName(base::threading::getCurrentThreadId()));
  }
  if (logFormat->hasFlag(base::FormatFlags::DateTime)) {
    // DateTime
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kDateTimeFormatSpecifier,
        base::utils::DateTime::getDateTime(logFormat->dateTimeFormat().c_str(),
                                           &tc->subsecondPrecision(logMessage->level())));
  }
  if (logFormat->hasFlag(base::FormatFlags::Function)) {
    // Function
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFunctionFormatSpecifier, logMessage->func());
  }
  if (logFormat->hasFlag(base::FormatFlags::File)) {
    // File
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::FileBase)) {
    // FileBase
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildBaseFilename(logMessage->file(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileBaseFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Line)) {
    // Line
    char* buf = base::utils::Str::clearBuff(buff, base::consts::kSourceLineMaxLength);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(), base::consts::kSourceLineMaxLength, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLineFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Location)) {
    // Location
    char* buf = base::utils::Str::clearBuff(buff,
                                            base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    buf = base::utils::Str::addToBuff(buff, buf, bufLim);
    buf = base::utils::Str::addToBuff(":", buf, bufLim);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(),  base::consts::kSourceLineMaxLength, buf, bufLim,
          false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLocationFormatSpecifier, std::string(buff));
  }
  if (logMessage->level() == Level::Verbose && logFormat->hasFlag(base::FormatFlags::VerboseLevel)) {
    // Verbose level
    char* buf = base::utils::Str::clearBuff(buff, 1);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->verboseLevel(), 1, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kVerboseLevelFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::LogMessage)) {
    // Log message
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kMessageFormatSpecifier, logMessage->message());
  }
#if !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  el::base::threading::ScopedLock lock_(ELPP->customFormatSpecifiersLock());
  ELPP_UNUSED(lock_);
  for (std::vector<CustomFormatSpecifier>::const_iterator it = ELPP->customFormatSpecifiers()->begin();
       it != ELPP->customFormatSpecifiers()->end(); ++it) {
    std::string fs(it->formatSpecifier());
    base::type::string_t wcsFormatSpecifier(fs.begin(), fs.end());
    base::utils::Str::replaceFirstWithEscape(logLine, wcsFormatSpecifier, it->resolver()(logMessage));
  }
#endif  // !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  if (appendNewLine) logLine += ELPP_LITERAL("\n");
  return logLine;
}